

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.c
# Opt level: O3

int showmatch(int f,int n)

{
  char *pcVar1;
  byte bVar2;
  line *plVar3;
  bool bVar4;
  mgwin *pmVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  balance *pbVar9;
  uint uVar10;
  line *plVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  int iVar18;
  line *plVar19;
  byte local_148 [264];
  ulong local_40;
  int local_38;
  int local_34;
  
  if (n < 1) {
    return 1;
  }
  iVar18 = 0;
  local_38 = n;
LAB_00114223:
  iVar6 = selfinsert(8,1);
  pmVar5 = curwp;
  if (iVar6 != 1) {
    return iVar6;
  }
  uVar7 = (uint)key.k_chars[(long)key.k_count + -1];
  pbVar9 = bal;
  if (uVar7 != 0x29) {
    lVar8 = 0;
    do {
      lVar12 = lVar8;
      uVar10 = uVar7;
      if (lVar12 == 6) goto LAB_00114277;
      lVar8 = lVar12 + 2;
    } while (key.k_chars[(long)key.k_count + -1] != (short)(&bal[1].right)[lVar12]);
    pbVar9 = (balance *)(&bal[1].left + lVar12);
  }
  uVar10 = (int)pbVar9->left;
LAB_00114277:
  plVar3 = curwp->w_dotp;
  iVar6 = curwp->w_doto;
  uVar13 = (ulong)(iVar6 - 1);
  iVar14 = 0;
  plVar19 = plVar3;
  do {
    local_34 = iVar18;
    if ((int)uVar13 == 0) {
      plVar19 = plVar19->l_bp;
      if (plVar19 == curbp->b_headp) {
        dobeep();
        goto LAB_0011449d;
      }
      piVar17 = &plVar19->l_used;
      uVar15 = plVar19->l_used;
LAB_001142d5:
      uVar16 = (uint)*curbp->b_nlchr;
      uVar13 = (ulong)uVar15;
    }
    else {
      piVar17 = &plVar19->l_used;
      uVar15 = plVar19->l_used;
      uVar13 = (long)(int)uVar13 - 1;
      if ((uint)uVar13 == uVar15) goto LAB_001142d5;
      uVar16 = (uint)(byte)plVar19->l_text[uVar13];
    }
    if (uVar16 == uVar10) {
      if (iVar14 == 0) break;
      iVar14 = iVar14 + -1;
    }
    iVar14 = iVar14 + (uint)(uVar16 == uVar7);
  } while( true );
  plVar11 = curwp->w_linep;
  if (plVar11 != plVar3->l_fp) {
    bVar4 = false;
    do {
      if (plVar11 == plVar19) {
        bVar4 = true;
      }
      plVar11 = plVar11->l_fp;
    } while (plVar11 != plVar3->l_fp);
    if (bVar4) {
      curwp->w_dotp = plVar19;
      pmVar5->w_doto = (int)uVar13;
      pcVar1 = &pmVar5->w_rflag;
      *pcVar1 = *pcVar1 | 2;
      update(2);
      ttwait(1000);
      pmVar5 = curwp;
      curwp->w_dotp = plVar3;
      pmVar5->w_doto = iVar6;
      pcVar1 = &pmVar5->w_rflag;
      *pcVar1 = *pcVar1 | 2;
      update(2);
      goto LAB_0011449d;
    }
  }
  lVar8 = 0;
  if (0 < (int)uVar15) {
    lVar12 = 1;
    uVar7 = 0;
    do {
      bVar2 = plVar19->l_text[lVar12 + -1];
      if ((ulong)bVar2 == 9) {
        iVar18 = ntabstop(uVar7,curbp->b_tabw);
        if ((int)uVar7 < iVar18) {
          local_40 = (ulong)uVar7;
          uVar10 = 0xfe - uVar7;
          if (~uVar7 + iVar18 < 0xfe - uVar7) {
            uVar10 = ~uVar7 + iVar18;
          }
          memset(local_148 + local_40,0x20,(ulong)(uVar10 + 1));
          uVar13 = 0;
          if (local_40 < 0xff) {
            uVar13 = 0xfe - local_40;
          }
          if (~local_40 + (long)iVar18 < uVar13) {
            uVar13 = ~local_40 + (long)iVar18;
          }
          uVar7 = uVar7 + (int)uVar13 + 1;
        }
      }
      else if ((cinfo[bVar2] & 8U) == 0) {
        uVar7 = uVar7 + 1;
        local_148[lVar8] = bVar2;
      }
      else {
        if (0xfc < uVar7) break;
        uVar13 = (ulong)uVar7;
        local_148[lVar8] = 0x5e;
        uVar7 = uVar7 + 2;
        local_148[uVar13 + 1] = bVar2 ^ 0x40;
      }
      lVar8 = (long)(int)uVar7;
      if ((*piVar17 <= lVar12) || (lVar12 = lVar12 + 1, 0xfe < uVar7)) break;
    } while( true );
  }
  local_148[lVar8] = 0;
  ewprintf("Matches %s",local_148);
  n = local_38;
LAB_0011449d:
  iVar18 = local_34 + 1;
  if (iVar18 == n) {
    return 1;
  }
  goto LAB_00114223;
}

Assistant:

int
showmatch(int f, int n)
{
	int	i, s;

	for (i = 0; i < n; i++) {
		if ((s = selfinsert(FFRAND, 1)) != TRUE)
			return (s);
		/* unbalanced -- warn user */
		if (balance() != TRUE)
			dobeep();
	}
	return (TRUE);
}